

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  TrackerBase *in_RDI;
  
  in_RDI->m_runState = Failed;
  if (in_RDI->m_parent != (ITracker *)0x0) {
    (*(in_RDI->m_parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[0xc])();
  }
  moveToParent(in_RDI);
  TrackerContext::completeCycle(in_RDI->m_ctx);
  return;
}

Assistant:

virtual void fail() CATCH_OVERRIDE {
            m_runState = Failed;
            if( m_parent )
                m_parent->markAsNeedingAnotherRun();
            moveToParent();
            m_ctx.completeCycle();
        }